

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGeneric.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintTwoGeneric::ArchiveOUT(ChConstraintTwoGeneric *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChConstraintTwoGeneric>(marchive);
  ChConstraintTwo::ArchiveOUT(&this->super_ChConstraintTwo,marchive);
  return;
}

Assistant:

void ChConstraintTwoGeneric::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChConstraintTwoGeneric>();

    // serialize the parent class data too
    ChConstraintTwo::ArchiveOUT(marchive);

    // serialize all member data:
    // NOTHING INTERESTING TO SERIALIZE (the Cq jacobians are not so
    // important to waste disk space.. they may be recomputed run-time,
    // and pointers to variables must be rebound in run-time.)
    // mstream << Cq_a;
    // mstream << Cq_b;
}